

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall FIX::double_conversion::StringBuilder::AddCharacter(StringBuilder *this,char c)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char c_local;
  StringBuilder *this_local;
  
  if (c == '\0') {
    __assert_fail("c != \'\\0\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                  ,0xf3,"void FIX::double_conversion::StringBuilder::AddCharacter(char)");
  }
  bVar3 = is_finalized(this);
  bVar2 = false;
  if (!bVar3) {
    iVar1 = this->position_;
    iVar4 = Vector<char>::length(&this->buffer_);
    bVar2 = iVar1 < iVar4;
  }
  if (!bVar2) {
    __assert_fail("!is_finalized() && position_ < buffer_.length()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                  ,0xf4,"void FIX::double_conversion::StringBuilder::AddCharacter(char)");
  }
  iVar1 = this->position_;
  this->position_ = iVar1 + 1;
  pcVar5 = Vector<char>::operator[](&this->buffer_,iVar1);
  *pcVar5 = c;
  return;
}

Assistant:

void AddCharacter(char c) {
    ASSERT(c != '\0');
    ASSERT(!is_finalized() && position_ < buffer_.length());
    buffer_[position_++] = c;
  }